

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

void mpack_write_i64(mpack_writer_t *writer,int64_t value)

{
  _Bool _Var1;
  uint8_t *u;
  char *pcVar2;
  ulong uVar3;
  uint uVar4;
  
  if (0x7f < value) {
    mpack_write_u64(writer,value);
    return;
  }
  if (value < -0x20) {
    if ((ulong)value < 0xffffffffffffff80) {
      if ((ulong)value < 0xffffffffffff8000) {
        pcVar2 = writer->current;
        uVar3 = (long)writer->end - (long)pcVar2;
        if ((ulong)value < 0xffffffff80000000) {
          if (uVar3 < 9) {
            _Var1 = mpack_writer_ensure(writer,9);
            if (!_Var1) {
              return;
            }
            pcVar2 = writer->current;
          }
          *pcVar2 = -0x2d;
          *(ulong *)(pcVar2 + 1) =
               (ulong)value >> 0x38 | (value & 0xff000000000000U) >> 0x28 |
               (value & 0xff0000000000U) >> 0x18 | (value & 0xff00000000U) >> 8 |
               (value & 0xff000000U) << 8 | (value & 0xff0000U) << 0x18 | (value & 0xff00U) << 0x28
               | value << 0x38;
          writer->current = writer->current + 9;
        }
        else {
          if (uVar3 < 5) {
            _Var1 = mpack_writer_ensure(writer,5);
            if (!_Var1) {
              return;
            }
            pcVar2 = writer->current;
          }
          *pcVar2 = -0x2e;
          uVar4 = (uint)value;
          *(uint *)(pcVar2 + 1) =
               uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
          writer->current = writer->current + 5;
        }
      }
      else {
        pcVar2 = writer->current;
        if ((ulong)((long)writer->end - (long)pcVar2) < 3) {
          _Var1 = mpack_writer_ensure(writer,3);
          if (!_Var1) {
            return;
          }
          pcVar2 = writer->current;
        }
        *pcVar2 = -0x2f;
        *(ushort *)(pcVar2 + 1) = (ushort)value << 8 | (ushort)value >> 8;
        writer->current = writer->current + 3;
      }
    }
    else {
      pcVar2 = writer->current;
      if ((ulong)((long)writer->end - (long)pcVar2) < 2) {
        _Var1 = mpack_writer_ensure(writer,2);
        if (!_Var1) {
          return;
        }
        pcVar2 = writer->current;
      }
      *pcVar2 = -0x30;
      pcVar2[1] = (char)value;
      writer->current = writer->current + 2;
    }
  }
  else {
    pcVar2 = writer->current;
    if (writer->end == pcVar2) {
      _Var1 = mpack_writer_ensure(writer,1);
      if (!_Var1) {
        return;
      }
      pcVar2 = writer->current;
    }
    *pcVar2 = (char)value;
    writer->current = writer->current + 1;
  }
  return;
}

Assistant:

void mpack_write_i64(mpack_writer_t* writer, int64_t value) {
    #if MPACK_OPTIMIZE_FOR_SIZE
    if (value > 127) {
        // for non-fix positive ints we call the u64 writer to save space
        mpack_write_u64(writer, (uint64_t)value);
        return;
    }
    #endif

    mpack_writer_track_element(writer);
    if (value >= -32) {
        #if MPACK_OPTIMIZE_FOR_SIZE
        MPACK_WRITE_ENCODED(mpack_encode_fixint, MPACK_TAG_SIZE_FIXINT, (int8_t)value);
        #else
        if (value <= 127) {
            MPACK_WRITE_ENCODED(mpack_encode_fixint, MPACK_TAG_SIZE_FIXINT, (int8_t)value);
        } else if (value <= UINT8_MAX) {
            MPACK_WRITE_ENCODED(mpack_encode_u8, MPACK_TAG_SIZE_U8, (uint8_t)value);
        } else if (value <= UINT16_MAX) {
            MPACK_WRITE_ENCODED(mpack_encode_u16, MPACK_TAG_SIZE_U16, (uint16_t)value);
        } else if (value <= UINT32_MAX) {
            MPACK_WRITE_ENCODED(mpack_encode_u32, MPACK_TAG_SIZE_U32, (uint32_t)value);
        } else {
            MPACK_WRITE_ENCODED(mpack_encode_u64, MPACK_TAG_SIZE_U64, (uint64_t)value);
        }
        #endif
    } else if (value >= INT8_MIN) {
        MPACK_WRITE_ENCODED(mpack_encode_i8, MPACK_TAG_SIZE_I8, (int8_t)value);
    } else if (value >= INT16_MIN) {
        MPACK_WRITE_ENCODED(mpack_encode_i16, MPACK_TAG_SIZE_I16, (int16_t)value);
    } else if (value >= INT32_MIN) {
        MPACK_WRITE_ENCODED(mpack_encode_i32, MPACK_TAG_SIZE_I32, (int32_t)value);
    } else {
        MPACK_WRITE_ENCODED(mpack_encode_i64, MPACK_TAG_SIZE_I64, value);
    }
}